

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,int aIndex,char *apValue)

{
  int aRet;
  sqlite3_stmt *pStmt;
  int ret;
  char *apValue_local;
  int aIndex_local;
  Statement *this_local;
  
  pStmt = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  aRet = sqlite3_bind_text(pStmt,aIndex,apValue,-1,(_func_void_void_ptr *)0x0);
  check(this,aRet);
  return;
}

Assistant:

void Statement::bindNoCopy(const int aIndex, const char* apValue)
{
    const int ret = sqlite3_bind_text(mStmtPtr, aIndex, apValue, -1, SQLITE_STATIC);
    check(ret);
}